

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O0

void __thiscall
rsg::AssignStatement::tokenize(AssignStatement *this,GeneratorState *state,TokenStream *str)

{
  char *identifier;
  TokenStream *pTVar1;
  Token local_70;
  Token local_60;
  Token local_50 [2];
  Token local_30;
  TokenStream *local_20;
  TokenStream *str_local;
  GeneratorState *state_local;
  AssignStatement *this_local;
  
  local_20 = str;
  str_local = (TokenStream *)state;
  state_local = (GeneratorState *)this;
  identifier = rsg::Variable::getName(this->m_variable);
  Token::Token(&local_30,identifier);
  pTVar1 = TokenStream::operator<<(str,&local_30);
  Token::Token(local_50,EQUAL);
  TokenStream::operator<<(pTVar1,local_50);
  Token::~Token(local_50);
  Token::~Token(&local_30);
  (*this->m_valueExpr->_vptr_Expression[3])(this->m_valueExpr,str_local,local_20);
  pTVar1 = local_20;
  Token::Token(&local_60,SEMICOLON);
  pTVar1 = TokenStream::operator<<(pTVar1,&local_60);
  Token::Token(&local_70,NEWLINE);
  TokenStream::operator<<(pTVar1,&local_70);
  Token::~Token(&local_70);
  Token::~Token(&local_60);
  return;
}

Assistant:

void AssignStatement::tokenize (GeneratorState& state, TokenStream& str) const
{
	str << Token(m_variable->getName()) << Token::EQUAL;
	m_valueExpr->tokenize(state, str);
	str << Token::SEMICOLON << Token::NEWLINE;
}